

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O1

ref<immutable::transient_rrb<int,_false,_6>_> __thiscall
immutable::transient_rrb_push<int,false,6>
          (immutable *this,ref<immutable::transient_rrb<int,_false,_6>_> *trrb,int element)

{
  guid_type guid;
  transient_rrb<int,_false,_6> *ptVar1;
  leaf_node<int,_false> *plVar2;
  internal_node<int,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  byte bVar5;
  byte bVar6;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<int,false>> *prVar7;
  internal_node<int,_false> *p_node;
  tree_node<int,_false> *ptVar8;
  char *__function;
  uint uVar9;
  ref<immutable::transient_rrb<int,_false,_6>_> *prVar10;
  uint32_t k;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t empty_height;
  bool bVar14;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old_tail;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  ref<immutable::rrb_details::tree_node<int,_false>_> temp;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_50;
  ref<immutable::transient_rrb<int,_false,_6>_> *local_48;
  transient_rrb<int,_false,_6> *local_40;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_38;
  
  rrb_details::check_transience<int,false,6>(trrb);
  ptVar1 = trrb->ptr;
  if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
    if ((ulong)ptVar1->tail_len < 0x40) {
      plVar2 = (ptVar1->tail).ptr;
      if (plVar2 != (leaf_node<int,_false> *)0x0) {
        plVar2->child[ptVar1->tail_len] = element;
        ptVar1->cnt = ptVar1->cnt + 1;
        ptVar1->tail_len = ptVar1->tail_len + 1;
        plVar2->len = plVar2->len + 1;
        *(transient_rrb<int,_false,_6> **)this = ptVar1;
        ptVar1->_ref_count = ptVar1->_ref_count + 1;
        return (ref<immutable::transient_rrb<int,_false,_6>_>)(transient_rrb<int,_false,_6> *)this;
      }
LAB_0014ecaa:
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
      ;
      goto LAB_0014ecbf;
    }
    ptVar1->cnt = ptVar1->cnt + 1;
    guid = ptVar1->guid;
    local_38.ptr = (leaf_node<int,_false> *)malloc(0x118);
    (local_38.ptr)->type = LEAF_NODE;
    (local_38.ptr)->len = 0;
    (local_38.ptr)->child = (int *)(local_38.ptr + 1);
    (local_38.ptr)->guid = guid;
    local_38.ptr[1].type = element;
    (local_38.ptr)->len = 1;
    (local_38.ptr)->_ref_count = 1;
    ptVar1->tail_len = 1;
    local_60.ptr = (ptVar1->tail).ptr;
    if (local_60.ptr != (leaf_node<int,_false> *)0x0) {
      (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&ptVar1->tail,&local_38);
    ptVar1 = trrb->ptr;
    if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
      piVar3 = (internal_node<int,_false> *)(ptVar1->root).ptr;
      if (piVar3 == (internal_node<int,_false> *)0x0) {
        ptVar1->shift = 0;
        if (local_60.ptr != (leaf_node<int,_false> *)0x0) {
          (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
        }
        local_50.ptr = (ptVar1->root).ptr;
        (ptVar1->root).ptr = (tree_node<int,_false> *)local_60.ptr;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_50);
        ptVar1 = trrb->ptr;
        *(transient_rrb<int,_false,_6> **)this = ptVar1;
        if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
          ptVar1->_ref_count = ptVar1->_ref_count + 1;
        }
        goto LAB_0014ec30;
      }
      uVar11 = ptVar1->cnt;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      uVar12 = uVar11 - 2;
      uVar11 = ptVar1->shift;
      empty_height = 0;
      k = 0;
      local_58.ptr = piVar3;
      local_48 = trrb;
      local_40 = (transient_rrb<int,_false,_6> *)this;
      do {
        if (uVar11 < 7) {
          if (uVar11 == 0) {
            uVar11 = 0;
          }
          else {
            if (local_58.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014ec7c;
            empty_height = empty_height + 1;
            if ((local_58.ptr)->len < 0x40) {
              k = empty_height;
            }
          }
          goto LAB_0014ea52;
        }
        if (local_58.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014ec7c;
        prVar4 = ((local_58.ptr)->size_table).ptr;
        uVar13 = uVar12;
        if (prVar4 == (rrb_size_table<false> *)0x0) {
          bVar6 = (byte)uVar11;
          bVar5 = bVar6 + 6 & 0x1f;
          bVar14 = uVar12 >> bVar5 == 0;
          if (bVar14) {
            trrb = (ref<immutable::transient_rrb<int,_false,_6>_> *)
                   (ulong)(uVar12 >> (bVar6 & 0x1f) & 0x3f);
            uVar13 = uVar12 & ~(0x3f << (bVar6 & 0x1f));
          }
          else {
            empty_height = empty_height + 1;
          }
          bVar14 = !bVar14;
          uVar9 = uVar12 >> bVar5;
          uVar12 = uVar13;
          if (uVar9 == 0) goto LAB_0014e98b;
        }
        else {
          uVar9 = (local_58.ptr)->len - 1;
          trrb = (ref<immutable::transient_rrb<int,_false,_6>_> *)(ulong)uVar9;
          if (uVar9 == 0) {
            trrb = (ref<immutable::transient_rrb<int,_false,_6>_> *)0x0;
          }
          else {
            uVar13 = uVar12 - prVar4->size[(local_58.ptr)->len - 2];
          }
LAB_0014e98b:
          empty_height = empty_height + 1;
          if ((uint)trrb < 0x3f) {
            k = empty_height;
          }
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                    (&local_58,(local_58.ptr)->child + ((ulong)trrb & 0xffffffff));
          uVar12 = uVar13;
          if (local_58.ptr == (internal_node<int,_false> *)0x0) {
            bVar14 = true;
            k = empty_height;
          }
          else {
            uVar11 = uVar11 - 6;
            bVar14 = false;
          }
        }
      } while (!bVar14);
      this = (immutable *)local_40;
      if (bVar14) {
LAB_0014ea52:
        this = (immutable *)local_40;
        prVar10 = local_48;
        if (6 < uVar11) {
          empty_height = empty_height + (uVar11 - 7) / 6 + 1;
        }
        if (k == 0) {
          ptVar1 = local_48->ptr;
          if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
            piVar3 = (internal_node<int,_false> *)(ptVar1->root).ptr;
            if (piVar3 != (internal_node<int,_false> *)0x0) {
              piVar3->_ref_count = piVar3->_ref_count + 1;
            }
            p_node = (internal_node<int,_false> *)malloc(0x220);
            p_node->type = INTERNAL_NODE;
            p_node->len = 0;
            p_node->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(p_node + 1);
            (p_node->size_table).ptr = (rrb_size_table<false> *)0x0;
            memset(p_node + 1,0,0x200);
            p_node->guid = guid;
            p_node->len = 2;
            p_node->_ref_count = 1;
            ref<immutable::rrb_details::internal_node<int,false>>::operator=
                      ((ref<immutable::rrb_details::internal_node<int,false>> *)p_node->child,
                       &ptVar1->root);
            ptVar1 = prVar10->ptr;
            if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
              p_node->_ref_count = p_node->_ref_count + 1;
              local_50.ptr = (ptVar1->root).ptr;
              (ptVar1->root).ptr = (tree_node<int,_false> *)p_node;
              ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_50);
              ptVar1 = prVar10->ptr;
              if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
                ptVar1->shift = ptVar1->shift + 6;
                if (piVar3 == (internal_node<int,_false> *)0x0) {
LAB_0014ec7c:
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
                  ;
                  goto LAB_0014ecbf;
                }
                if ((piVar3->type != LEAF_NODE) &&
                   ((piVar3->size_table).ptr != (rrb_size_table<false> *)0x0)) {
                  ptVar8 = (tree_node<int,_false> *)malloc(0x110);
                  *(tree_node<int,_false> **)ptVar8 = ptVar8 + 1;
                  ptVar8->guid = guid;
                  if (local_60.ptr == (leaf_node<int,_false> *)0x0) goto LAB_0014ecaa;
                  ptVar8[1].type = ~(local_60.ptr)->len + ptVar1->cnt;
                  ptVar8[1].len = ptVar1->cnt - 1;
                  ptVar8->_ref_count = 1;
                  local_50.ptr = ptVar8;
                  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                            (&p_node->size_table,
                             (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_50);
                  if ((local_50.ptr != (tree_node<int,_false> *)0x0) &&
                     (uVar11 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar11 - 1,
                     uVar11 == 1)) {
                    free(local_50.ptr);
                  }
                }
                prVar10 = local_48;
                if (local_48->ptr != (transient_rrb<int,_false,_6> *)0x0) {
                  prVar7 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                           rrb_details::new_editable_path<int,false,6>
                                     ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                                      (*(long *)&(local_48->ptr->root).ptr[1]._ref_count + 8),
                                      empty_height,guid);
                  ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar7,&local_60)
                  ;
                  rrb_details::release<int>(p_node);
                  rrb_details::release<int>(piVar3);
                  goto LAB_0014ec18;
                }
              }
            }
          }
          goto LAB_0014ec93;
        }
        to_set = rrb_details::mutate_first_k<int,false,6>(local_48,k);
        prVar7 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                 rrb_details::new_editable_path<int,false,6>(to_set,empty_height - k,guid);
        ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar7,&local_60);
LAB_0014ec18:
        ptVar1 = prVar10->ptr;
        *(transient_rrb<int,_false,_6> **)this = ptVar1;
        if (ptVar1 != (transient_rrb<int,_false,_6> *)0x0) {
          ptVar1->_ref_count = ptVar1->_ref_count + 1;
        }
      }
      rrb_details::release<int>(local_58.ptr);
LAB_0014ec30:
      if ((local_60.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar11 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar11 - 1, uVar11 == 1)
         ) {
        free(local_60.ptr);
      }
      if ((local_38.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar11 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar11 - 1, uVar11 == 1)
         ) {
        free(local_38.ptr);
      }
      return (ref<immutable::transient_rrb<int,_false,_6>_>)(transient_rrb<int,_false,_6> *)this;
    }
  }
LAB_0014ec93:
  __function = 
  "T *immutable::ref<immutable::transient_rrb<int, false, 6>>::operator->() const [T = immutable::transient_rrb<int, false, 6>]"
  ;
LAB_0014ecbf:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> transient_rrb_push(ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, T element)
    {
    using namespace rrb_details;
    check_transience(trrb);
    if (trrb->tail_len < bits<N>::rrb_branching)
      {
      T* loc = (T*)((char*)trrb->tail->child + trrb->tail_len * sizeof(T));
      loc = new(loc) T(std::move(element)); // placement new      

      //trrb->tail->child[trrb->tail_len] = std::move(element);
      trrb->cnt++;
      trrb->tail_len++;
      trrb->tail->len++;
      // ^ consider deferring incrementing this until insertion and/or persistentified.
      return trrb;
      }

    trrb->cnt++;
    guid_type guid = trrb->guid;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = transient_leaf_node_create<T, atomic_ref_counting, N>();
    new_tail->guid = guid;
    
    T* loc = (T*)((char*)new_tail->child);
    loc = new(loc) T(std::move(element)); // placement new   

    //new_tail->child[0] = std::move(element);
    new_tail->len = 1;
    trrb->tail_len = 1;

    ref<leaf_node<T, atomic_ref_counting>> old_tail = trrb->tail;
    trrb->tail = new_tail;

    if (trrb->root.ptr == nullptr)
      { // If it's  null, we can't just mutate it down.
      trrb->shift = 0;
      trrb->root = old_tail;
      return trrb;
      }
    // mutable count starts here

    // TODO: Can find last rightmost jump in constant time for pvec subvecs:
    // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

    uint32_t index = trrb->cnt - 2;

    uint32_t nodes_to_mutate = 0;
    uint32_t nodes_visited = 0;
    uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                      // mutable node (or the element, if we can mutate the leaf)
    ref<internal_node<T, atomic_ref_counting>> current = trrb->root;

    uint32_t shift = trrb->shift;

    // checking all non-leaf nodes (or if tail, all but the lowest two levels)
    while (shift > bits<N>::rrb_bits)
      {
      // calculate child index
      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        // some check here to ensure we're not overflowing the pvec subvec.
        // important to realise that this only needs to be done once in a better
        // impl, the same way the size_table check only has to be done until it's
        // false.
        const uint32_t prev_shift = shift + bits<N>::rrb_bits;
        if (index >> prev_shift > 0)
          {
          nodes_visited++; // this could possibly be done earlier in the code.
          goto mutable_count_end;
          }
        child_index = (index >> shift) & bits<N>::rrb_mask;
        // index filtering is not necessary when the check above is performed at
        // most once.
        index &= ~(bits<N>::rrb_mask << shift);
        }
      else
        {
        // no need for sized_pos here, luckily.
        child_index = current->len - 1;
        // Decrement index
        if (child_index != 0)
          {
          index -= current->size_table->size[child_index - 1];
          }
        }
      nodes_visited++;
      if (child_index < bits<N>::rrb_mask)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;
        }

      current = current->child[child_index];
      // This will only happen in a pvec subtree
      if (current.ptr == nullptr)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;

        // if next element we're looking at is null, we can mutate all above. Good
        // times.
        goto mutable_count_end;
        }
      shift -= bits<N>::rrb_bits;
      }
    // if we're here, we're at the leaf node (or lowest non-leaf), which is
    // `current`

    // no need to even use index here: We know it'll be placed at current->len,
    // if there's enough space. That check is easy.
    if (shift != 0)
      {
      nodes_visited++;
      if (current->len < bits<N>::rrb_branching)
        {
        nodes_to_mutate = nodes_visited;
        pos = current->len;
        }
      }

  mutable_count_end:
    // GURRHH, nodes_visited is not yet handled nicely. loop down to get
    // nodes_visited set straight.
    while (shift > bits<N>::rrb_bits)
      {
      nodes_visited++;
      shift -= bits<N>::rrb_bits;
      }

    // Increasing height of tree.
    if (nodes_to_mutate == 0)
      {
      ref<internal_node<T, atomic_ref_counting>> old_root = trrb->root;
      ref<internal_node<T, atomic_ref_counting>> new_root = transient_internal_node_create<T, atomic_ref_counting, N>();
      new_root->guid = guid;
      new_root->len = 2;
      new_root->child[0] = trrb->root;
      trrb->root = new_root;
      trrb->shift = trrb->shift + bits<N>::rrb_bits;

      // create size table if the original rrb root has a size table.
      if (old_root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)old_root.ptr)->size_table.ptr != nullptr)
        {
        rrb_size_table<atomic_ref_counting>* table = transient_size_table_create<N, atomic_ref_counting>();
        table->guid = guid;
        table->size[0] = trrb->cnt - (old_tail->len + 1);
        // If we insert the tail, the old size minus (new size minus one) the old
        // tail size will be the amount of elements in the left branch. If there
        // is no tail, the size is just the old rrb-tree.

        table->size[1] = trrb->cnt - 1;
        // If we insert the tail, the old size would include the tail.
        // Consequently, it has to be the old size. If we have no tail, we append
        // a single element to the old vector, therefore it has to be one more
        // than the original (which means it is zero)

        new_root->size_table = table;
        }

      // nodes visited == original rrb tree height. Nodes visited > 0.
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(&((internal_node<T, atomic_ref_counting> *)trrb->root.ptr)->child[1], nodes_visited, guid);
      *to_set = old_tail;
      }
    else
      {
      ref<internal_node<T, atomic_ref_counting>>* node = mutate_first_k(trrb, nodes_to_mutate);
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(node, nodes_visited - nodes_to_mutate, guid);
      *to_set = old_tail;
      }

    return trrb;
    }